

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eventregister.cpp
# Opt level: O0

unique_ptr<Event,_std::default_delete<Event>_> * __thiscall
EventRegister::on(EventRegister *this,string *event)

{
  bool bVar1;
  mapped_type *this_00;
  EventRegister *local_40;
  unique_ptr<Event,_std::default_delete<Event>_> local_38;
  unique_ptr<Event,_std::default_delete<Event>_> ev;
  _Self local_28;
  string *local_20;
  string *event_local;
  EventRegister *this_local;
  
  local_20 = event;
  event_local = (string *)this;
  toLower(event);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
       ::find(&this->m_events,event);
  ev._M_t.super___uniq_ptr_impl<Event,_std::default_delete<Event>_>._M_t.
  super__Tuple_impl<0UL,_Event_*,_std::default_delete<Event>_>.super__Head_base<0UL,_Event_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<Event,_std::default_delete<Event>,_true,_true>)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
       ::end(&this->m_events);
  bVar1 = std::operator!=(&local_28,(_Self *)&ev);
  if (bVar1) {
    this_local = (EventRegister *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
                 ::operator[](&this->m_events,event);
  }
  else {
    local_40 = this;
    std::make_unique<Event,EventRegister*,std::__cxx11::string&>
              ((EventRegister **)&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
              ::operator[](&this->m_events,event);
    std::unique_ptr<Event,_std::default_delete<Event>_>::operator=(this_00,&local_38);
    this_local = (EventRegister *)
                 std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Event,_std::default_delete<Event>_>_>_>_>
                 ::operator[](&this->m_events,event);
    std::unique_ptr<Event,_std::default_delete<Event>_>::~unique_ptr(&local_38);
  }
  return (unique_ptr<Event,_std::default_delete<Event>_> *)this_local;
}

Assistant:

const std::unique_ptr<Event> &EventRegister::on(std::string event)
{
    toLower(event);
    if (m_events.find(event) != m_events.end()) {
        return m_events[event];
    }

    std::unique_ptr<Event> ev = std::make_unique<Event>(this, event);
    m_events[event] = std::move(ev);
    return m_events[event];
}